

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Detect.cpp
# Opt level: O0

void processInput(string *inpFilePath,int insSz,int stdDev,int readLen,double coverage,
                 string *outFolderPath,bool verbose,uint threads)

{
  size_t *this;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
  *this_00;
  bool bVar1;
  int *piVar2;
  RefVector *__x;
  reference pRVar3;
  mapped_type *pmVar4;
  reference ptVar5;
  reference psVar6;
  element_type *peVar7;
  shared_ptr<transwarp::value_task<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>_>_>_>
  *in_stack_fffffffffffffb60;
  BamReader *in_stack_fffffffffffffb70;
  undefined1 local_410 [8];
  shared_ptr<transwarp::task<void>_> task_1;
  iterator __end1_3;
  iterator __begin1_3;
  vector<std::shared_ptr<transwarp::task<void>_>,_std::allocator<std::shared_ptr<transwarp::task<void>_>_>_>
  *__range1_3;
  shared_ptr<transwarp::task<void>_> task;
  iterator __end1_2;
  iterator __begin1_2;
  vector<std::shared_ptr<transwarp::task<void>_>,_std::allocator<std::shared_ptr<transwarp::task<void>_>_>_>
  *__range1_2;
  shared_ptr<transwarp::value_task<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3b0;
  shared_ptr<transwarp::value_task<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>_>_>_>
  local_3a0;
  shared_ptr<transwarp::value_task<bool>_> local_390;
  shared_ptr<transwarp::value_task<int>_> local_380;
  shared_ptr<transwarp::value_task<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>_>
  local_370;
  shared_ptr<transwarp::value_task<std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>_>_>
  local_360;
  shared_ptr<transwarp::value_task<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
  local_350;
  undefined1 local_338 [8];
  shared_ptr<_157937eb_> processTask;
  shared_ptr<transwarp::value_task<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  outFolderTask;
  shared_ptr<transwarp::value_task<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  inpFileTask;
  shared_ptr<transwarp::value_task<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>_>_>_>
  exRegionsTask;
  shared_ptr<transwarp::value_task<bool>_> verboseTask;
  shared_ptr<transwarp::value_task<int>_> bpRegionTask;
  shared_ptr<transwarp::value_task<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>_>
  mapTask;
  shared_ptr<transwarp::value_task<std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>_>_>
  refTask;
  shared_ptr<transwarp::value_task<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
  regionTask;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
  inpRegion;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
  *__range1_1;
  vector<std::shared_ptr<transwarp::task<void>_>,_std::allocator<std::shared_ptr<transwarp::task<void>_>_>_>
  tasks;
  parallel executor;
  int bpRegion;
  int i;
  RefData d;
  iterator __end1;
  iterator __begin1;
  RefVector *__range1;
  undefined1 local_130 [4];
  int refCo;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  revRefMap;
  RefVector ref;
  BamReader local_e0;
  BamReader br;
  string inpIntervalsFilePath;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
  inpRegions;
  undefined1 local_90 [8];
  string excludeFilePath;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>_>
  exRegions;
  int local_38;
  bool local_31;
  string *psStack_30;
  bool verbose_local;
  string *outFolderPath_local;
  double coverage_local;
  int local_18;
  int readLen_local;
  int stdDev_local;
  int insSz_local;
  string *inpFilePath_local;
  
  INTRA_ALIGN_SCORE = readLen / 2;
  local_38 = 1;
  exRegions._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = (int)(coverage / 10.0);
  local_31 = verbose;
  psStack_30 = outFolderPath;
  outFolderPath_local = (string *)coverage;
  coverage_local._4_4_ = readLen;
  local_18 = stdDev;
  readLen_local = insSz;
  _stdDev_local = inpFilePath;
  piVar2 = std::max<int>(&stack0xffffffffffffffc8,
                         (int *)((long)&exRegions._M_t._M_impl.super__Rb_tree_header._M_node_count +
                                4));
  MIN_SC_CLUSTER_SUPPORT = *piVar2;
  MIN_SPLIT_SUPPORT = MIN_SC_CLUSTER_SUPPORT;
  MIN_DISC_CLUSTER_SUPPORT = MIN_SC_CLUSTER_SUPPORT;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>_>
         *)((long)&excludeFilePath.field_2 + 8));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,
                 psStack_30,&excludeFileName_abi_cxx11_);
  openExcludeRegions((string *)local_90,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>_>
                      *)((long)&excludeFilePath.field_2 + 8));
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
  ::vector((vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
            *)((long)&inpIntervalsFilePath.field_2 + 8));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&br,psStack_30
                 ,&inpIntervalFileName_abi_cxx11_);
  openInputIntervals((string *)&br,
                     (vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
                      *)((long)&inpIntervalsFilePath.field_2 + 8));
  BamTools::BamReader::BamReader(in_stack_fffffffffffffb70);
  bVar1 = openInput(_stdDev_local,&local_e0);
  if (bVar1) {
    __x = BamTools::BamReader::GetReferenceData((BamReader *)0x274111);
    std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>::vector
              ((vector<BamTools::RefData,_std::allocator<BamTools::RefData>_> *)
               &revRefMap._M_t._M_impl.super__Rb_tree_header._M_node_count,__x);
    BamTools::BamReader::Close((BamReader *)0x27413b);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           *)local_130);
    __range1._4_4_ = 0;
    this = &revRefMap._M_t._M_impl.super__Rb_tree_header._M_node_count;
    __end1 = std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>::begin
                       ((vector<BamTools::RefData,_std::allocator<BamTools::RefData>_> *)this);
    d._32_8_ = std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>::end
                         ((vector<BamTools::RefData,_std::allocator<BamTools::RefData>_> *)this);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<BamTools::RefData_*,_std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>_>
                                       *)&d.RefLength), bVar1) {
      pRVar3 = __gnu_cxx::
               __normal_iterator<BamTools::RefData_*,_std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>_>
               ::operator*(&__end1);
      BamTools::RefData::RefData((RefData *)&bpRegion,pRVar3);
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                             *)local_130,(key_type *)&bpRegion);
      *pmVar4 = __range1._4_4_;
      __range1._4_4_ = __range1._4_4_ + 1;
      BamTools::RefData::~RefData((RefData *)&bpRegion);
      __gnu_cxx::
      __normal_iterator<BamTools::RefData_*,_std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>_>
      ::operator++(&__end1);
    }
    for (executor.pool_.mutex_.super___mutex_base._M_mutex._36_4_ = 0;
        (int)executor.pool_.mutex_.super___mutex_base._M_mutex._36_4_ < 3;
        executor.pool_.mutex_.super___mutex_base._M_mutex._36_4_ =
             executor.pool_.mutex_.super___mutex_base._M_mutex._36_4_ + 1) {
      headerOutput(psStack_30,executor.pool_.mutex_.super___mutex_base._M_mutex._36_4_);
    }
    executor.pool_.mutex_.super___mutex_base._M_mutex._32_4_ = readLen_local + local_18 * 3;
    transwarp::parallel::parallel
              ((parallel *)
               &tasks.
                super__Vector_base<std::shared_ptr<transwarp::task<void>_>,_std::allocator<std::shared_ptr<transwarp::task<void>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)threads);
    std::
    vector<std::shared_ptr<transwarp::task<void>_>,_std::allocator<std::shared_ptr<transwarp::task<void>_>_>_>
    ::vector((vector<std::shared_ptr<transwarp::task<void>_>,_std::allocator<std::shared_ptr<transwarp::task<void>_>_>_>
              *)&__range1_1);
    this_00 = (vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
               *)((long)&inpIntervalsFilePath.field_2 + 8);
    __end1_1 = std::
               vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
               ::begin(this_00);
    inpRegion.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
    ._M_head_impl.field_2._8_8_ =
         std::
         vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
         ::end(this_00);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1_1,
                              (__normal_iterator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_*,_std::vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>_>
                               *)((long)&inpRegion.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                                         ._M_head_impl.field_2 + 8)), bVar1) {
      ptVar5 = __gnu_cxx::
               __normal_iterator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_*,_std::vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>_>
               ::operator*(&__end1_1);
      std::
      tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
      ::tuple((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
               *)&regionTask.
                  super___shared_ptr<transwarp::value_task<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount,ptVar5);
      transwarp::make_value_task<std::tuple<std::__cxx11::string,int,int>&>
                ((transwarp *)
                 &refTask.
                  super___shared_ptr<transwarp::value_task<std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount,
                 (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
                  *)&regionTask.
                     super___shared_ptr<transwarp::value_task<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount);
      transwarp::make_value_task<std::vector<BamTools::RefData,std::allocator<BamTools::RefData>>&>
                ((transwarp *)
                 &mapTask.
                  super___shared_ptr<transwarp::value_task<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount,
                 (vector<BamTools::RefData,_std::allocator<BamTools::RefData>_> *)
                 &revRefMap._M_t._M_impl.super__Rb_tree_header._M_node_count);
      transwarp::
      make_value_task<std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>&>
                ((transwarp *)
                 &bpRegionTask.
                  super___shared_ptr<transwarp::value_task<int>,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                  *)local_130);
      transwarp::make_value_task<int&>
                ((transwarp *)
                 &verboseTask.
                  super___shared_ptr<transwarp::value_task<bool>,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,
                 (int *)(executor.pool_.mutex_.super___mutex_base._M_mutex.__size + 0x20));
      transwarp::make_value_task<bool_const&>
                ((transwarp *)
                 &exRegionsTask.
                  super___shared_ptr<transwarp::value_task<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount,&local_31);
      transwarp::
      make_value_task<std::map<std::__cxx11::string,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>&>
                ((transwarp *)
                 &inpFileTask.
                  super___shared_ptr<transwarp::value_task<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>_>
                  *)((long)&excludeFilePath.field_2 + 8));
      transwarp::make_value_task<std::__cxx11::string_const&>
                ((transwarp *)
                 &outFolderTask.
                  super___shared_ptr<transwarp::value_task<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount,_stdDev_local);
      transwarp::make_value_task<std::__cxx11::string_const&>
                ((transwarp *)&processTask.super___shared_ptr<_ad2835a3_>._M_refcount,psStack_30);
      std::
      shared_ptr<transwarp::value_task<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
      ::shared_ptr(&local_350,
                   (shared_ptr<transwarp::value_task<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
                    *)&refTask.
                       super___shared_ptr<transwarp::value_task<std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount);
      std::
      shared_ptr<transwarp::value_task<std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>_>_>
      ::shared_ptr(&local_360,
                   (shared_ptr<transwarp::value_task<std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>_>_>
                    *)&mapTask.
                       super___shared_ptr<transwarp::value_task<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount);
      std::
      shared_ptr<transwarp::value_task<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>_>
      ::shared_ptr(&local_370,
                   (shared_ptr<transwarp::value_task<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>_>
                    *)&bpRegionTask.
                       super___shared_ptr<transwarp::value_task<int>,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount);
      std::shared_ptr<transwarp::value_task<int>_>::shared_ptr
                (&local_380,
                 (shared_ptr<transwarp::value_task<int>_> *)
                 &verboseTask.
                  super___shared_ptr<transwarp::value_task<bool>,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::shared_ptr<transwarp::value_task<bool>_>::shared_ptr
                (&local_390,
                 (shared_ptr<transwarp::value_task<bool>_> *)
                 &exRegionsTask.
                  super___shared_ptr<transwarp::value_task<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      in_stack_fffffffffffffb60 = &local_3a0;
      std::
      shared_ptr<transwarp::value_task<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>_>_>_>
      ::shared_ptr(in_stack_fffffffffffffb60,
                   (shared_ptr<transwarp::value_task<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>_>_>_>
                    *)&inpFileTask.
                       super___shared_ptr<transwarp::value_task<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount);
      std::
      shared_ptr<transwarp::value_task<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::shared_ptr(&local_3b0,
                   (shared_ptr<transwarp::value_task<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&outFolderTask.
                       super___shared_ptr<transwarp::value_task<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount);
      std::
      shared_ptr<transwarp::value_task<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::shared_ptr((shared_ptr<transwarp::value_task<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&__range1_2,
                   (shared_ptr<transwarp::value_task<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&processTask.super___shared_ptr<_ad2835a3_>._M_refcount);
      transwarp::
      make_task<transwarp::consume_type,void(&)(std::tuple<std::__cxx11::string,int,int>const&,std::vector<BamTools::RefData,std::allocator<BamTools::RefData>>const&,std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>const&,int,bool,std::map<std::__cxx11::string,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>const&,std::__cxx11::string_const&,std::__cxx11::string_const&),transwarp::value_task<std::tuple<std::__cxx11::string,int,int>>,transwarp::value_task<std::vector<BamTools::RefData,std::allocator<BamTools::RefData>>>,transwarp::value_task<std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>>,transwarp::value_task<int>,transwarp::value_task<bool>,transwarp::value_task<std::map<std::__cxx11::string,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>>,transwarp::value_task<std::__cxx11::string>,transwarp::value_task<std::__cxx11::string>>
                (local_338,parallelProcess,&local_350,&local_360,&local_370,&local_380,&local_390,
                 in_stack_fffffffffffffb60,&local_3b0,
                 (shared_ptr<transwarp::value_task<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&__range1_2);
      std::
      shared_ptr<transwarp::value_task<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~shared_ptr((shared_ptr<transwarp::value_task<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&__range1_2);
      std::
      shared_ptr<transwarp::value_task<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~shared_ptr(&local_3b0);
      std::
      shared_ptr<transwarp::value_task<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>_>_>_>
      ::~shared_ptr(&local_3a0);
      std::shared_ptr<transwarp::value_task<bool>_>::~shared_ptr(&local_390);
      std::shared_ptr<transwarp::value_task<int>_>::~shared_ptr(&local_380);
      std::
      shared_ptr<transwarp::value_task<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>_>
      ::~shared_ptr(&local_370);
      std::
      shared_ptr<transwarp::value_task<std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>_>_>
      ::~shared_ptr(&local_360);
      std::
      shared_ptr<transwarp::value_task<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
      ::~shared_ptr(&local_350);
      std::
      vector<std::shared_ptr<transwarp::task<void>>,std::allocator<std::shared_ptr<transwarp::task<void>>>>
      ::
      emplace_back<std::shared_ptr<transwarp::task_impl<transwarp::consume_type,void(*)(std::tuple<std::__cxx11::string,int,int>const&,std::vector<BamTools::RefData,std::allocator<BamTools::RefData>>const&,std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>const&,int,bool,std::map<std::__cxx11::string,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>const&,std::__cxx11::string_const&,std::__cxx11::string_const&),std::tuple<std::__cxx11::string,int,int>,std::vector<BamTools::RefData,std::allocator<BamTools::RefData>>,std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>,int,bool,std::map<std::__cxx11::string,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>,std::__cxx11::string,std::__cxx11::string>>&>
                ((vector<std::shared_ptr<transwarp::task<void>>,std::allocator<std::shared_ptr<transwarp::task<void>>>>
                  *)&__range1_1,(shared_ptr<_157937eb_> *)local_338);
      std::shared_ptr<$157937eb$>::~shared_ptr((shared_ptr<_157937eb_> *)local_338);
      std::
      shared_ptr<transwarp::value_task<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~shared_ptr((shared_ptr<transwarp::value_task<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&processTask.super___shared_ptr<_ad2835a3_>._M_refcount);
      std::
      shared_ptr<transwarp::value_task<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~shared_ptr((shared_ptr<transwarp::value_task<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&outFolderTask.
                        super___shared_ptr<transwarp::value_task<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount);
      std::
      shared_ptr<transwarp::value_task<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>_>_>_>
      ::~shared_ptr((shared_ptr<transwarp::value_task<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>_>_>_>
                     *)&inpFileTask.
                        super___shared_ptr<transwarp::value_task<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount);
      std::shared_ptr<transwarp::value_task<bool>_>::~shared_ptr
                ((shared_ptr<transwarp::value_task<bool>_> *)
                 &exRegionsTask.
                  super___shared_ptr<transwarp::value_task<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      std::shared_ptr<transwarp::value_task<int>_>::~shared_ptr
                ((shared_ptr<transwarp::value_task<int>_> *)
                 &verboseTask.
                  super___shared_ptr<transwarp::value_task<bool>,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::
      shared_ptr<transwarp::value_task<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>_>
      ::~shared_ptr((shared_ptr<transwarp::value_task<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>_>
                     *)&bpRegionTask.
                        super___shared_ptr<transwarp::value_task<int>,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
      std::
      shared_ptr<transwarp::value_task<std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>_>_>
      ::~shared_ptr((shared_ptr<transwarp::value_task<std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>_>_>
                     *)&mapTask.
                        super___shared_ptr<transwarp::value_task<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount);
      std::
      shared_ptr<transwarp::value_task<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
      ::~shared_ptr((shared_ptr<transwarp::value_task<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
                     *)&refTask.
                        super___shared_ptr<transwarp::value_task<std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>_>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount);
      std::
      tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
      ::~tuple((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
                *)&regionTask.
                   super___shared_ptr<transwarp::value_task<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount);
      __gnu_cxx::
      __normal_iterator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_*,_std::vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>_>
      ::operator++(&__end1_1);
    }
    __end1_2 = std::
               vector<std::shared_ptr<transwarp::task<void>_>,_std::allocator<std::shared_ptr<transwarp::task<void>_>_>_>
               ::begin((vector<std::shared_ptr<transwarp::task<void>_>,_std::allocator<std::shared_ptr<transwarp::task<void>_>_>_>
                        *)&__range1_1);
    task.super___shared_ptr<transwarp::task<void>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         std::
         vector<std::shared_ptr<transwarp::task<void>_>,_std::allocator<std::shared_ptr<transwarp::task<void>_>_>_>
         ::end((vector<std::shared_ptr<transwarp::task<void>_>,_std::allocator<std::shared_ptr<transwarp::task<void>_>_>_>
                *)&__range1_1);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1_2,
                              (__normal_iterator<std::shared_ptr<transwarp::task<void>_>_*,_std::vector<std::shared_ptr<transwarp::task<void>_>,_std::allocator<std::shared_ptr<transwarp::task<void>_>_>_>_>
                               *)&task.
                                  super___shared_ptr<transwarp::task<void>,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount), bVar1) {
      psVar6 = __gnu_cxx::
               __normal_iterator<std::shared_ptr<transwarp::task<void>_>_*,_std::vector<std::shared_ptr<transwarp::task<void>_>,_std::allocator<std::shared_ptr<transwarp::task<void>_>_>_>_>
               ::operator*(&__end1_2);
      std::shared_ptr<transwarp::task<void>_>::shared_ptr
                ((shared_ptr<transwarp::task<void>_> *)&__range1_3,psVar6);
      peVar7 = std::
               __shared_ptr_access<transwarp::task<void>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<transwarp::task<void>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&__range1_3);
      (*(peVar7->super_itask)._vptr_itask[0x1c])
                (peVar7,&tasks.
                         super__Vector_base<std::shared_ptr<transwarp::task<void>_>,_std::allocator<std::shared_ptr<transwarp::task<void>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::shared_ptr<transwarp::task<void>_>::~shared_ptr
                ((shared_ptr<transwarp::task<void>_> *)&__range1_3);
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<transwarp::task<void>_>_*,_std::vector<std::shared_ptr<transwarp::task<void>_>,_std::allocator<std::shared_ptr<transwarp::task<void>_>_>_>_>
      ::operator++(&__end1_2);
    }
    __end1_3 = std::
               vector<std::shared_ptr<transwarp::task<void>_>,_std::allocator<std::shared_ptr<transwarp::task<void>_>_>_>
               ::begin((vector<std::shared_ptr<transwarp::task<void>_>,_std::allocator<std::shared_ptr<transwarp::task<void>_>_>_>
                        *)&__range1_1);
    task_1.super___shared_ptr<transwarp::task<void>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         std::
         vector<std::shared_ptr<transwarp::task<void>_>,_std::allocator<std::shared_ptr<transwarp::task<void>_>_>_>
         ::end((vector<std::shared_ptr<transwarp::task<void>_>,_std::allocator<std::shared_ptr<transwarp::task<void>_>_>_>
                *)&__range1_1);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1_3,
                              (__normal_iterator<std::shared_ptr<transwarp::task<void>_>_*,_std::vector<std::shared_ptr<transwarp::task<void>_>,_std::allocator<std::shared_ptr<transwarp::task<void>_>_>_>_>
                               *)&task_1.
                                  super___shared_ptr<transwarp::task<void>,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount), bVar1) {
      psVar6 = __gnu_cxx::
               __normal_iterator<std::shared_ptr<transwarp::task<void>_>_*,_std::vector<std::shared_ptr<transwarp::task<void>_>,_std::allocator<std::shared_ptr<transwarp::task<void>_>_>_>_>
               ::operator*(&__end1_3);
      std::shared_ptr<transwarp::task<void>_>::shared_ptr
                ((shared_ptr<transwarp::task<void>_> *)local_410,psVar6);
      peVar7 = std::
               __shared_ptr_access<transwarp::task<void>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<transwarp::task<void>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_410);
      (*(peVar7->super_itask)._vptr_itask[0x37])();
      std::shared_ptr<transwarp::task<void>_>::~shared_ptr
                ((shared_ptr<transwarp::task<void>_> *)local_410);
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<transwarp::task<void>_>_*,_std::vector<std::shared_ptr<transwarp::task<void>_>,_std::allocator<std::shared_ptr<transwarp::task<void>_>_>_>_>
      ::operator++(&__end1_3);
    }
    std::
    vector<std::shared_ptr<transwarp::task<void>_>,_std::allocator<std::shared_ptr<transwarp::task<void>_>_>_>
    ::~vector((vector<std::shared_ptr<transwarp::task<void>_>,_std::allocator<std::shared_ptr<transwarp::task<void>_>_>_>
               *)&__range1_1);
    transwarp::parallel::~parallel
              ((parallel *)
               &tasks.
                super__Vector_base<std::shared_ptr<transwarp::task<void>_>,_std::allocator<std::shared_ptr<transwarp::task<void>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            *)local_130);
    std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>::~vector
              ((vector<BamTools::RefData,_std::allocator<BamTools::RefData>_> *)
               &revRefMap._M_t._M_impl.super__Rb_tree_header._M_node_count);
  }
  BamTools::BamReader::~BamReader((BamReader *)in_stack_fffffffffffffb60);
  std::__cxx11::string::~string((string *)&br);
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
  ::~vector((vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
             *)((long)&inpIntervalsFilePath.field_2 + 8));
  std::__cxx11::string::~string((string *)local_90);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>_>
          *)((long)&excludeFilePath.field_2 + 8));
  return;
}

Assistant:

void processInput(const std::string &inpFilePath, const int insSz, const int stdDev, const int readLen, const double coverage, const std::string &outFolderPath, const bool verbose, const unsigned int threads)
{
	INTRA_ALIGN_SCORE = readLen / 2;
	MIN_SC_CLUSTER_SUPPORT = MIN_SPLIT_SUPPORT = MIN_DISC_CLUSTER_SUPPORT = std::max(1, (int)(coverage / 10));

	std::map<std::string, std::vector<std::pair<long, long>>> exRegions;
	std::string excludeFilePath = outFolderPath + excludeFileName;
	openExcludeRegions(excludeFilePath, exRegions);

	std::vector<std::tuple<std::string, int, int>> inpRegions;
	std::string inpIntervalsFilePath = outFolderPath + inpIntervalFileName;
	openInputIntervals(inpIntervalsFilePath, inpRegions);

	BamTools::BamReader br;
	if (!openInput(inpFilePath, br))
	{
		return;
	}

	BamTools::RefVector ref = br.GetReferenceData();

	br.Close();

	std::map<std::string, int> revRefMap;

	int refCo = 0;
	for (auto d : ref)
	{
		revRefMap[d.RefName] = refCo;
		refCo++;
	}

	for (int i = 0; i < 3; i++)
		headerOutput(outFolderPath, i);

	int bpRegion = insSz + (3 * stdDev);

	transwarp::parallel executor{threads};

	std::vector<std::shared_ptr<transwarp::task<void>>> tasks;

	for (auto inpRegion : inpRegions)
	{
		auto regionTask = transwarp::make_value_task(inpRegion);
		auto refTask = transwarp::make_value_task(ref);
		auto mapTask = transwarp::make_value_task(revRefMap);
		auto bpRegionTask = transwarp::make_value_task(bpRegion);
		auto verboseTask = transwarp::make_value_task(verbose);
		auto exRegionsTask = transwarp::make_value_task(exRegions);
		auto inpFileTask = transwarp::make_value_task(inpFilePath);
		auto outFolderTask = transwarp::make_value_task(outFolderPath);

		auto processTask = transwarp::make_task(transwarp::consume, parallelProcess, regionTask, refTask, mapTask, bpRegionTask, verboseTask, exRegionsTask, inpFileTask, outFolderTask);

		tasks.emplace_back(processTask);
	}

	for (auto task : tasks)
	{
		task->schedule(executor);
	}

	for (auto task : tasks)
	{
		task->get();
	}
}